

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::assertReturn(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertReturn *assn)

{
  Literal LVar1;
  Literal LVar2;
  Literal LVar3;
  byte bVar4;
  bool bVar5;
  size_t sVar6;
  size_type sVar7;
  ostream *poVar8;
  ulong uVar9;
  Literal *pLVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  NaNResult nan_00;
  undefined8 in_stack_fffffffffffff898;
  ostream *in_stack_fffffffffffff8a0;
  Type in_stack_fffffffffffff8a8;
  Ok local_679;
  Err local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  string *local_638;
  Err *e_2;
  Literal local_610;
  undefined1 local_5f8 [8];
  Result<wasm::Ok> check_2;
  undefined1 local_5c8 [4];
  Index i_2;
  array<wasm::Literal,_2UL> vals_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string *local_558;
  Err *e_1;
  Literal local_530;
  undefined1 local_518 [8];
  Result<wasm::Ok> check_1;
  undefined1 local_4e8 [4];
  Index i_1;
  array<wasm::Literal,_4UL> vals;
  type *lanes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string *local_440;
  Err *e;
  uintptr_t uStack_430;
  Literal local_420;
  undefined1 local_408 [8];
  Result<wasm::Ok> check;
  type *nan;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  Literal local_398;
  uintptr_t local_380;
  uintptr_t local_378;
  uintptr_t local_370;
  add_pointer_t<wasm::WATParser::RefResult> local_368;
  type *ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  Literal local_320;
  Literal local_308;
  add_pointer_t<wasm::Literal> local_2f0;
  type *v;
  value_type *expected;
  Literal val;
  anon_class_16_2_e5cbf392 atIndex;
  undefined1 local_2b0 [4];
  Index i;
  string local_290;
  uint local_26c;
  string local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  SmallVector<wasm::Literal,_1UL> *local_200;
  type *values;
  undefined1 local_1e8 [8];
  ActionResult result;
  stringstream err;
  ostream local_198 [376];
  AssertReturn *local_20;
  AssertReturn *assn_local;
  Shell *this_local;
  
  local_20 = assn;
  assn_local = (AssertReturn *)this;
  this_local = (Shell *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             ((long)&result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
             + 0x38));
  doAction((ActionResult *)local_1e8,this,&local_20->action);
  local_200 = &std::
               get_if<wasm::Literals,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                         ((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                           *)local_1e8)->super_SmallVector<wasm::Literal,_1UL>;
  if (local_200 == (SmallVector<wasm::Literal,_1UL> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"expected return, got ",&local_241);
    resultToString_abi_cxx11_(&local_268,this,(ActionResult *)local_1e8);
    std::operator+(&local_220,&local_240,&local_268);
    ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&local_220);
    ::wasm::Err::~Err((Err *)&local_220);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    local_26c = 1;
  }
  else {
    sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size(local_200);
    sVar7 = std::
            vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
            ::size(&local_20->expected);
    if (sVar6 == sVar7) {
      for (atIndex.i._4_4_ = 0; uVar9 = (ulong)atIndex.i._4_4_,
          sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size(local_200), uVar9 < sVar6;
          atIndex.i._4_4_ = atIndex.i._4_4_ + 1) {
        val.type.id = (uintptr_t)&local_200;
        atIndex.values = (type **)((long)&atIndex.i + 4);
        pLVar10 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                            (local_200,(ulong)atIndex.i._4_4_);
        ::wasm::Literal::Literal((Literal *)&expected,pLVar10);
        v = (type *)std::
                    vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                    ::operator[](&local_20->expected,(ulong)atIndex.i._4_4_);
        local_2f0 = std::
                    get_if<wasm::Literal,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                              ((variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                                *)v);
        if (local_2f0 == (add_pointer_t<wasm::Literal>)0x0) {
          local_368 = std::
                      get_if<wasm::WATParser::RefResult,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                                ((variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                                  *)v);
          if (local_368 == (add_pointer_t<wasm::WATParser::RefResult>)0x0) {
            check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
                 std::
                 get_if<wasm::WATParser::NaNResult,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                           ((variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                             *)v);
            if ((add_pointer_t<wasm::WATParser::NaNResult>)
                check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ ==
                (add_pointer_t<wasm::WATParser::NaNResult>)0x0) {
              vals._M_elems[3].type.id =
                   (uintptr_t)
                   std::
                   get_if<std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                             ((variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                               *)v);
              if ((add_pointer_t<std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                   )vals._M_elems[3].type.id ==
                  (add_pointer_t<std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                   )0x0) {
                ::wasm::handle_unreachable
                          ("unexpected expectation",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                           ,0x16d);
              }
              sVar7 = std::
                      vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                      ::size((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                              *)vals._M_elems[3].type.id);
              if (sVar7 == 2) {
                ::wasm::Literal::getLanesF64x2();
                for (check_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                    (uint)check_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ < 2;
                    check_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ =
                         check_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ + 1) {
                  pvVar13 = std::array<wasm::Literal,_2UL>::operator[]
                                      ((array<wasm::Literal,_2UL> *)local_5c8,
                                       (ulong)(uint)check_2.val.
                                                    super__Variant_base<wasm::Ok,_wasm::Err>.
                                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                                                                        
                                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
                                                  _36_4_);
                  ::wasm::Literal::Literal(&local_610,pvVar13);
                  pvVar12 = std::
                            vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ::operator[]((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                                          *)vals._M_elems[3].type.id,
                                         (ulong)(uint)check_2.val.
                                                      super__Variant_base<wasm::Ok,_wasm::Err>.
                                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                                                                            
                                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
                                                  _36_4_);
                  std::variant<wasm::Literal,_wasm::WATParser::NaNResult>::variant
                            ((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&e_2,pvVar12);
                  checkLane((Result<wasm::Ok> *)local_5f8,this,&local_610,(LaneResult *)&e_2,
                            check_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_);
                  std::variant<wasm::Literal,_wasm::WATParser::NaNResult>::~variant
                            ((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&e_2);
                  ::wasm::Literal::~Literal(&local_610);
                  in_stack_fffffffffffff8a8.id =
                       (uintptr_t)::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5f8);
                  bVar5 = (string *)in_stack_fffffffffffff8a8.id != (string *)0x0;
                  local_638 = (string *)in_stack_fffffffffffff8a8.id;
                  if (bVar5) {
                    in_stack_fffffffffffff8a0 =
                         std::operator<<(local_198,(string *)in_stack_fffffffffffff8a8.id);
                    assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::
                    operator()[abi_cxx11_(&local_658,&val.type);
                    std::operator<<(in_stack_fffffffffffff8a0,(string *)&local_658);
                    std::__cxx11::string::~string((string *)&local_658);
                    std::__cxx11::stringstream::str();
                    ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_678);
                    ::wasm::Err::~Err(&local_678);
                  }
                  local_26c = (uint)bVar5;
                  ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5f8);
                  if (local_26c != 0) goto LAB_001e4350;
                }
                local_26c = 5;
LAB_001e4350:
                std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_5c8);
              }
              else {
                if (sVar7 != 4) {
                  ::wasm::handle_unreachable
                            ("unexpected number of lanes",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                             ,0x16a);
                }
                ::wasm::Literal::getLanesF32x4();
                for (check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                    (uint)check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ < 4;
                    check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ =
                         check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ + 1) {
                  pvVar11 = std::array<wasm::Literal,_4UL>::operator[]
                                      ((array<wasm::Literal,_4UL> *)local_4e8,
                                       (ulong)(uint)check_1.val.
                                                    super__Variant_base<wasm::Ok,_wasm::Err>.
                                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                                                                        
                                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
                                                  _36_4_);
                  ::wasm::Literal::Literal(&local_530,pvVar11);
                  pvVar12 = std::
                            vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                            ::operator[]((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                                          *)vals._M_elems[3].type.id,
                                         (ulong)(uint)check_1.val.
                                                      super__Variant_base<wasm::Ok,_wasm::Err>.
                                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                                                                            
                                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
                                                  _36_4_);
                  std::variant<wasm::Literal,_wasm::WATParser::NaNResult>::variant
                            ((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&e_1,pvVar12);
                  checkLane((Result<wasm::Ok> *)local_518,this,&local_530,(LaneResult *)&e_1,
                            check_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_);
                  std::variant<wasm::Literal,_wasm::WATParser::NaNResult>::~variant
                            ((variant<wasm::Literal,_wasm::WATParser::NaNResult> *)&e_1);
                  ::wasm::Literal::~Literal(&local_530);
                  local_558 = (string *)
                              ::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_518);
                  bVar5 = local_558 != (string *)0x0;
                  if (bVar5) {
                    poVar8 = std::operator<<(local_198,local_558);
                    assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::
                    operator()[abi_cxx11_(&local_578,&val.type);
                    std::operator<<(poVar8,(string *)&local_578);
                    std::__cxx11::string::~string((string *)&local_578);
                    std::__cxx11::stringstream::str();
                    ::wasm::Result<wasm::Ok>::Result
                              (__return_storage_ptr__,(Err *)&vals_1._M_elems[1].type);
                    ::wasm::Err::~Err((Err *)&vals_1._M_elems[1].type);
                  }
                  local_26c = (uint)bVar5;
                  ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_518);
                  if (local_26c != 0) goto LAB_001e40a1;
                }
                local_26c = 5;
LAB_001e40a1:
                std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_4e8);
              }
              if (local_26c == 5) {
LAB_001e43b3:
                local_26c = 0;
              }
            }
            else {
              ::wasm::Literal::Literal(&local_420,(Literal *)&expected);
              e = *(Err **)check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
              uStack_430 = *(uintptr_t *)
                            (check.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ + 8);
              nan_00._0_8_ = (ulong)e & 0xffffffff;
              nan_00.type.id = uStack_430;
              checkNaN((Result<wasm::Ok> *)local_408,this,&local_420,nan_00);
              ::wasm::Literal::~Literal(&local_420);
              local_440 = (string *)::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_408);
              bVar5 = local_440 != (string *)0x0;
              if (bVar5) {
                poVar8 = std::operator<<(local_198,local_440);
                assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                          (&local_460,&val.type);
                std::operator<<(poVar8,(string *)&local_460);
                std::__cxx11::string::~string((string *)&local_460);
                std::__cxx11::stringstream::str();
                ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&lanes);
                ::wasm::Err::~Err((Err *)&lanes);
              }
              local_26c = (uint)bVar5;
              ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_408);
              if (local_26c == 0) goto LAB_001e43b3;
            }
          }
          else {
            bVar5 = ::wasm::Type::isRef((Type *)&val.field_0.func.super_IString.str._M_str);
            if (bVar5) {
              local_370 = (uintptr_t)
                          ::wasm::Type::getHeapType
                                    ((Type *)&val.field_0.func.super_IString.str._M_str);
              local_378 = (local_368->type).id;
              bVar4 = ::wasm::HeapType::isSubType((HeapType)local_370,(HeapType)local_378);
              if ((bVar4 & 1) != 0) goto LAB_001e43b3;
            }
            poVar8 = std::operator<<(local_198,"expected ");
            local_380 = (local_368->type).id;
            poVar8 = (ostream *)::wasm::operator<<(poVar8,(HeapType)local_380);
            poVar8 = std::operator<<(poVar8," reference, got ");
            ::wasm::Literal::Literal(&local_398,(Literal *)&expected);
            LVar3.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff8a0;
            LVar3.field_0.i64 = in_stack_fffffffffffff898;
            LVar3.type.id = in_stack_fffffffffffff8a8.id;
            poVar8 = (ostream *)::wasm::operator<<(poVar8,LVar3);
            assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                      (&local_3b8,&val.type);
            std::operator<<(poVar8,(string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            ::wasm::Literal::~Literal(&local_398);
            std::__cxx11::stringstream::str();
            ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&nan);
            ::wasm::Err::~Err((Err *)&nan);
            local_26c = 1;
          }
        }
        else {
          bVar4 = ::wasm::Literal::operator!=((Literal *)&expected,local_2f0);
          if ((bVar4 & 1) == 0) goto LAB_001e43b3;
          poVar8 = std::operator<<(local_198,"expected ");
          ::wasm::Literal::Literal(&local_308,local_2f0);
          LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff8a0;
          LVar1.field_0.i64 = in_stack_fffffffffffff898;
          LVar1.type.id = in_stack_fffffffffffff8a8.id;
          poVar8 = (ostream *)::wasm::operator<<(poVar8,LVar1);
          poVar8 = std::operator<<(poVar8,", got ");
          ::wasm::Literal::Literal(&local_320,(Literal *)&expected);
          LVar2.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff8a0;
          LVar2.field_0.i64 = in_stack_fffffffffffff898;
          LVar2.type.id = in_stack_fffffffffffff8a8.id;
          poVar8 = (ostream *)::wasm::operator<<(poVar8,LVar2);
          assertReturn(wasm::WATParser::AssertReturn&)::{lambda()#1}::operator()[abi_cxx11_
                    (&local_340,&val.type);
          std::operator<<(poVar8,(string *)&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          ::wasm::Literal::~Literal(&local_320);
          ::wasm::Literal::~Literal(&local_308);
          std::__cxx11::stringstream::str();
          ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&ref);
          ::wasm::Err::~Err((Err *)&ref);
          local_26c = 1;
        }
        ::wasm::Literal::~Literal((Literal *)&expected);
        if (local_26c != 0) goto LAB_001e4418;
      }
      ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_679);
      local_26c = 1;
    }
    else {
      poVar8 = std::operator<<(local_198,"expected ");
      sVar7 = std::
              vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
              ::size(&local_20->expected);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar7);
      poVar8 = std::operator<<(poVar8," values, got ");
      resultToString_abi_cxx11_(&local_290,this,(ActionResult *)local_1e8);
      std::operator<<(poVar8,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::stringstream::str();
      ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_2b0);
      ::wasm::Err::~Err((Err *)local_2b0);
      local_26c = 1;
    }
  }
LAB_001e4418:
  std::variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>::
  ~variant((variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
            *)local_1e8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             ((long)&result.
                     super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                     .
                     super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
             + 0x38));
  return __return_storage_ptr__;
}

Assistant:

Result<> assertReturn(AssertReturn& assn) {
    std::stringstream err;
    auto result = doAction(assn.action);
    auto* values = std::get_if<Literals>(&result);
    if (!values) {
      return Err{std::string("expected return, got ") + resultToString(result)};
    }
    if (values->size() != assn.expected.size()) {
      err << "expected " << assn.expected.size() << " values, got "
          << resultToString(result);
      return Err{err.str()};
    }
    for (Index i = 0; i < values->size(); ++i) {
      auto atIndex = [&]() {
        if (values->size() <= 1) {
          return std::string{};
        }
        std::stringstream ss;
        ss << " at index " << i;
        return ss.str();
      };

      Literal val = (*values)[i];
      auto& expected = assn.expected[i];
      if (auto* v = std::get_if<Literal>(&expected)) {
        if (val != *v) {
          err << "expected " << *v << ", got " << val << atIndex();
          return Err{err.str()};
        }
      } else if (auto* ref = std::get_if<RefResult>(&expected)) {
        if (!val.type.isRef() ||
            !HeapType::isSubType(val.type.getHeapType(), ref->type)) {
          err << "expected " << ref->type << " reference, got " << val
              << atIndex();
          return Err{err.str()};
        }
      } else if (auto* nan = std::get_if<NaNResult>(&expected)) {
        auto check = checkNaN(val, *nan);
        if (auto* e = check.getErr()) {
          err << e->msg << atIndex();
          return Err{err.str()};
        }
      } else if (auto* lanes = std::get_if<LaneResults>(&expected)) {
        switch (lanes->size()) {
          case 4: {
            auto vals = val.getLanesF32x4();
            for (Index i = 0; i < 4; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          case 2: {
            auto vals = val.getLanesF64x2();
            for (Index i = 0; i < 2; ++i) {
              auto check = checkLane(vals[i], (*lanes)[i], i);
              if (auto* e = check.getErr()) {
                err << e->msg << atIndex();
                return Err{err.str()};
              }
            }
            break;
          }
          default:
            WASM_UNREACHABLE("unexpected number of lanes");
        }
      } else {
        WASM_UNREACHABLE("unexpected expectation");
      }
    }
    return Ok{};
  }